

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cpp
# Opt level: O2

void duckdb_brotli::BrotliCreateHuffmanTree
               (uint32_t *data,size_t length,int tree_limit,HuffmanTree *tree,uint8_t *depth)

{
  uint uVar1;
  HuffmanTree HVar2;
  int iVar3;
  HuffmanTree *pHVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  size_t sVar11;
  long lVar12;
  uint *puVar13;
  ulong uVar14;
  HuffmanTree *pHVar15;
  long lVar16;
  uint uVar17;
  HuffmanTree *pHVar18;
  ulong uVar19;
  long lVar20;
  
  uVar7 = 1;
LAB_00e39e95:
  lVar5 = 1;
  uVar6 = 0;
  pHVar4 = tree + 2;
  sVar8 = length;
  do {
    puVar13 = data + (sVar8 - 1);
    sVar11 = 0;
    do {
      if (sVar8 == sVar11) {
        if (uVar6 == 1) {
          depth[tree->index_right_or_value_] = '\x01';
          return;
        }
        if (0xc < uVar6) {
          for (uVar9 = (ulong)((uint)(uVar6 < 0x39) * 2); uVar9 != 6; uVar9 = uVar9 + 1) {
            uVar14 = *(ulong *)(kBrotliShellGaps + uVar9 * 8);
            pHVar15 = tree + uVar14;
            pHVar18 = tree;
            for (uVar19 = uVar14; uVar19 < uVar6; uVar19 = uVar19 + 1) {
              HVar2 = tree[uVar19];
              for (lVar10 = 0; uVar14 <= uVar19 + lVar10; lVar10 = lVar10 - uVar14) {
                if (pHVar18[lVar10].total_count_ == HVar2.total_count_) {
                  if (HVar2.index_right_or_value_ <= pHVar18[lVar10].index_right_or_value_) break;
                }
                else if (pHVar18[lVar10].total_count_ <= HVar2.total_count_) break;
                pHVar15[lVar10] = pHVar18[lVar10];
              }
              pHVar15[lVar10] = HVar2;
              pHVar15 = pHVar15 + 1;
              pHVar18 = pHVar18 + 1;
            }
          }
          goto LAB_00e39fb8;
        }
        uVar9 = 1;
        goto LAB_00e39efd;
      }
      uVar17 = *puVar13;
      sVar11 = sVar11 + 1;
      puVar13 = puVar13 + -1;
    } while (uVar17 == 0);
    if (uVar17 <= uVar7) {
      uVar17 = uVar7;
    }
    sVar8 = sVar8 - sVar11;
    tree[uVar6].total_count_ = uVar17;
    tree[uVar6].index_left_ = -1;
    tree[uVar6].index_right_or_value_ = (int16_t)sVar8;
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + -1;
    pHVar4 = pHVar4 + 1;
  } while( true );
LAB_00e39efd:
  if (uVar6 <= uVar9) goto LAB_00e39fb8;
  HVar2 = tree[uVar9];
  uVar14 = uVar9;
  do {
    uVar19 = uVar14 - 1;
    if (tree[uVar14 - 1].total_count_ == HVar2.total_count_) {
      if (HVar2.index_right_or_value_ <= tree[uVar19].index_right_or_value_) goto LAB_00e39f3e;
    }
    else if (tree[uVar14 - 1].total_count_ <= HVar2.total_count_) goto LAB_00e39f3e;
    tree[uVar14] = tree[uVar19];
    uVar14 = uVar19;
  } while (uVar19 != 0);
  uVar14 = 0;
LAB_00e39f3e:
  tree[uVar14] = HVar2;
  uVar9 = uVar9 + 1;
  goto LAB_00e39efd;
LAB_00e39fb8:
  pHVar15 = tree + uVar6;
  pHVar15->total_count_ = 0xffffffff;
  pHVar15->index_left_ = -1;
  pHVar15->index_right_or_value_ = -1;
  lVar10 = uVar6 + 1;
  pHVar15 = tree + uVar6 + 1;
  pHVar15->total_count_ = 0xffffffff;
  pHVar15->index_left_ = -1;
  pHVar15->index_right_or_value_ = -1;
  lVar12 = 0;
  for (; lVar5 != 0; lVar5 = lVar5 + 1) {
    uVar1 = tree[lVar12].total_count_;
    uVar17 = tree[lVar10].total_count_;
    lVar16 = lVar12;
    if (uVar17 < uVar1) {
      lVar16 = lVar10;
    }
    lVar12 = lVar12 + (ulong)(uVar1 <= uVar17);
    lVar10 = lVar10 + (ulong)(uVar17 < uVar1);
    uVar1 = tree[lVar12].total_count_;
    uVar17 = tree[lVar10].total_count_;
    lVar20 = lVar12;
    if (uVar17 < uVar1) {
      lVar20 = lVar10;
    }
    lVar12 = lVar12 + (ulong)(uVar1 <= uVar17);
    pHVar4[-1].total_count_ = tree[lVar20].total_count_ + tree[lVar16].total_count_;
    pHVar4[-1].index_left_ = (int16_t)lVar16;
    pHVar4[-1].index_right_or_value_ = (int16_t)lVar20;
    pHVar4->total_count_ = 0xffffffff;
    pHVar4->index_left_ = -1;
    pHVar4->index_right_or_value_ = -1;
    lVar10 = lVar10 + (ulong)(uVar17 < uVar1);
    pHVar4 = pHVar4 + 1;
  }
  iVar3 = BrotliSetDepth((int)uVar6 * 2 + -1,tree,depth,tree_limit);
  uVar7 = uVar7 * 2;
  if (iVar3 != 0) {
    return;
  }
  goto LAB_00e39e95;
}

Assistant:

void duckdb_brotli::BrotliCreateHuffmanTree(const uint32_t* data,
                             const size_t length,
                             const int tree_limit,
                             HuffmanTree* tree,
                             uint8_t* depth) {
  uint32_t count_limit;
  HuffmanTree sentinel;
  InitHuffmanTree(&sentinel, BROTLI_UINT32_MAX, -1, -1);
  /* For block sizes below 64 kB, we never need to do a second iteration
     of this loop. Probably all of our block sizes will be smaller than
     that, so this loop is mostly of academic interest. If we actually
     would need this, we would be better off with the Katajainen algorithm. */
  for (count_limit = 1; ; count_limit *= 2) {
    size_t n = 0;
    size_t i;
    size_t j;
    size_t k;
    for (i = length; i != 0;) {
      --i;
      if (data[i]) {
        const uint32_t count = BROTLI_MAX(uint32_t, data[i], count_limit);
        InitHuffmanTree(&tree[n++], count, -1, (int16_t)i);
      }
    }

    if (n == 1) {
      depth[tree[0].index_right_or_value_] = 1;  /* Only one element. */
      break;
    }

    SortHuffmanTreeItems(tree, n, SortHuffmanTree);

    /* The nodes are:
       [0, n): the sorted leaf nodes that we start with.
       [n]: we add a sentinel here.
       [n + 1, 2n): new parent nodes are added here, starting from
                    (n+1). These are naturally in ascending order.
       [2n]: we add a sentinel at the end as well.
       There will be (2n+1) elements at the end. */
    tree[n] = sentinel;
    tree[n + 1] = sentinel;

    i = 0;      /* Points to the next leaf node. */
    j = n + 1;  /* Points to the next non-leaf node. */
    for (k = n - 1; k != 0; --k) {
      size_t left, right;
      if (tree[i].total_count_ <= tree[j].total_count_) {
        left = i;
        ++i;
      } else {
        left = j;
        ++j;
      }
      if (tree[i].total_count_ <= tree[j].total_count_) {
        right = i;
        ++i;
      } else {
        right = j;
        ++j;
      }

      {
        /* The sentinel node becomes the parent node. */
        size_t j_end = 2 * n - k;
        tree[j_end].total_count_ =
            tree[left].total_count_ + tree[right].total_count_;
        tree[j_end].index_left_ = (int16_t)left;
        tree[j_end].index_right_or_value_ = (int16_t)right;

        /* Add back the last sentinel node. */
        tree[j_end + 1] = sentinel;
      }
    }
    if (BrotliSetDepth((int)(2 * n - 1), &tree[0], depth, tree_limit)) {
      /* We need to pack the Huffman tree in tree_limit bits. If this was not
         successful, add fake entities to the lowest values and retry. */
      break;
    }
  }
}